

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O0

Cnf_Dat_t * Cec_GiaDeriveGiaRemapped(Gia_Man_t *p)

{
  Aig_Man_t *pAig_00;
  Cnf_Dat_t *pCVar1;
  Aig_Man_t *pAig;
  Cnf_Dat_t *pCnf;
  Gia_Man_t *p_local;
  
  pAig_00 = Gia_ManToAigSimple(p);
  pAig_00->nRegs = 0;
  pCVar1 = Cnf_Derive(pAig_00,0);
  Aig_ManStop(pAig_00);
  return pCVar1;
}

Assistant:

static inline Cnf_Dat_t * Cec_GiaDeriveGiaRemapped( Gia_Man_t * p )
{
    Cnf_Dat_t * pCnf;
    Aig_Man_t * pAig = Gia_ManToAigSimple( p );
    pAig->nRegs = 0;
    pCnf = Cnf_Derive( pAig, 0 );//Aig_ManCoNum(pAig) );
    Aig_ManStop( pAig );
    return pCnf;
}